

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polynomial.cpp
# Opt level: O3

Integer mathiu::impl::degree(ExprPtr *ex,ExprPtr *varSet)

{
  _Variadic_union<matchit::impl::IdBlock<mathiu::impl::Sum>_*> _Var1;
  _Variadic_union<std::monostate,_const_mathiu::impl::Set_*,_bool> _Var2;
  long lVar3;
  bool bVar4;
  Integer IVar5;
  int iVar6;
  ostream *poVar7;
  variant_alternative_t<1UL,_variant<monostate,_const_Set_*,_bool>_> *value;
  __visit_result_t<matchit::impl::Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1321:44)>,_std::variant<matchit::impl::IdBlock<mathiu::impl::Set>,_matchit::impl::IdBlock<mathiu::impl::Set>_*>_&>
  pIVar8;
  _Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>,_std::_Identity<std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::shared_ptr<const_mathiu::impl::Expr>_>_>
  *p_Var9;
  variant_alternative_t<1UL,_variant<monostate,_const_Sum_*,_bool>_> *value_00;
  __visit_result_t<matchit::impl::Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1321:44)>,_std::variant<matchit::impl::IdBlock<mathiu::impl::Sum>,_matchit::impl::IdBlock<mathiu::impl::Sum>_*>_&>
  pIVar10;
  __visit_result_t<matchit::impl::Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1186:30),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1187:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1188:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1189:33)>,_const_std::variant<std::monostate,_mathiu::impl::Sum,_mathiu::impl::Sum_*,_const_mathiu::impl::Sum_*>_&>
  pSVar11;
  _Base_ptr p_Var12;
  IdBlockBase<mathiu::impl::Sum> *pIVar13;
  _Rb_tree_color _Var14;
  ExprPtr *ex_00;
  ExprPtr *ex_01;
  size_t *psVar15;
  IdProcess IVar16;
  _Rb_tree_header *p_Var17;
  initializer_list<std::shared_ptr<const_mathiu::impl::Expr>_> __l;
  RetType_conflict6 varSet_;
  allocator_type local_34a;
  ExprPtrLess local_349;
  _Variadic_union<std::monostate,_const_mathiu::impl::Sum_*,_bool> local_348;
  _Rb_tree_node_base _Stack_340;
  size_t local_320;
  _Variadic_union<std::monostate,_const_mathiu::impl::Set_*,_bool> local_318;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_310;
  undefined8 local_308;
  undefined8 uStack_300;
  long local_2f8;
  _Variadic_union<std::monostate,_const_mathiu::impl::Set_*,_bool> *local_2e8;
  _Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>,_std::_Identity<std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::shared_ptr<const_mathiu::impl::Expr>_>_>
  local_2e0;
  undefined1 local_2b0 [64];
  __index_type local_270;
  undefined1 local_268 [8];
  undefined1 auStack_260 [8];
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Set>,_matchit::impl::IdBlock<mathiu::impl::Set>_*>
  _Stack_258;
  App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>
  local_210;
  _Variadic_union<matchit::impl::IdBlock<mathiu::impl::Set>,_matchit::impl::IdBlock<mathiu::impl::Set>_*>
  *local_200;
  _Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>,_std::_Identity<std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::shared_ptr<const_mathiu::impl::Expr>_>_>
  *local_1f8;
  undefined1 local_1e8 [16];
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Set>,_matchit::impl::IdBlock<mathiu::impl::Set>_*>
  local_1d8;
  anon_class_1_0_00000001 *local_190;
  InternalPatternT<bool> IStack_188;
  undefined7 uStack_187;
  App<const_matchit::impl::AsPointer<mathiu::impl::Set>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Set>_>_>_>
  local_178;
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Sum>,_matchit::impl::IdBlock<mathiu::impl::Sum>_*>
  local_108;
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Set>,_matchit::impl::IdBlock<mathiu::impl::Set>_*>
  local_c0;
  _Variadic_union<matchit::impl::IdBlock<mathiu::impl::Set>,_matchit::impl::IdBlock<mathiu::impl::Set>_*>
  local_78;
  undefined1 local_38;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"degree: ",8);
  local_2e8 = (_Variadic_union<std::monostate,_const_mathiu::impl::Set_*,_bool> *)ex;
  toString_abi_cxx11_((string *)local_268,(impl *)ex,ex_00);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_268,(long)auStack_260);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,",\t",2);
  toString_abi_cxx11_((string *)local_1e8,(impl *)varSet,ex_01);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,(char *)local_1e8._0_8_,local_1e8._8_8_);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  if ((_Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Set>,_matchit::impl::IdBlock<mathiu::impl::Set>_*>
       *)local_1e8._0_8_ != &local_1d8) {
    operator_delete((void *)local_1e8._0_8_,(long)local_1d8._M_u._M_rest + 1);
  }
  if (local_268 != (undefined1  [8])&_Stack_258) {
    operator_delete((void *)local_268,(long)_Stack_258._M_u._M_rest + 1);
  }
  local_268 = (undefined1  [8])((ulong)local_268 & 0xffffffff00000000);
  auStack_260 = (undefined1  [8])0x0;
  _Stack_258._M_u._M_rest = (_Variadic_union<matchit::impl::IdBlock<mathiu::impl::Set>_*>)0x0;
  _Stack_258._M_u._8_8_ = 0;
  _Stack_258._M_u._16_8_ = 0;
  _Stack_258._M_u._24_8_ = 0;
  _Stack_258._M_u._32_8_ = 0;
  _Stack_258._M_u._40_8_ = 0;
  local_78._0_4_ = 0;
  local_78._M_first._M_storage._M_storage[0x38] = '\0';
  local_38 = 0;
  std::__detail::__variant::
  _Variant_storage<false,_std::monostate,_mathiu::impl::Set,_mathiu::impl::Set_*,_const_mathiu::impl::Set_*>
  ::~_Variant_storage((_Variant_storage<false,_std::monostate,_mathiu::impl::Set,_mathiu::impl::Set_*,_const_mathiu::impl::Set_*>
                       *)auStack_260);
  _Var1._M_first._M_storage =
       (_Uninitialized<matchit::impl::IdBlock<mathiu::impl::Sum>_*,_true>)
       (varSet->super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  matchit::impl::Id<mathiu::impl::Set>::Id
            ((Id<mathiu::impl::Set> *)&local_c0,(Id<mathiu::impl::Set> *)&local_78._M_first);
  matchit::impl::as<mathiu::impl::Set>::{lambda(auto:1)#1}::operator()
            (&local_178,(_lambda_auto_1__1_ *)&matchit::impl::as<mathiu::impl::Set>,
             (Id<mathiu::impl::Set> *)&local_c0);
  local_1e8._0_8_ = local_178.mUnary;
  local_1e8._8_8_ =
       local_178.mPattern.mPatterns.
       super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Set>_>_>
       .
       super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Set>_>_>
       .
       super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Set>_>,_false>
       ._M_head_impl.mUnary;
  matchit::impl::Id<mathiu::impl::Set>::Id
            ((Id<mathiu::impl::Set> *)&local_1d8,
             (InternalPatternT<matchit::impl::Id<mathiu::impl::Set>_> *)
             ((long)&local_178.mPattern.mPatterns.
                     super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Set>_>_>
                     .
                     super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Set>_>_>
                     .
                     super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Set>_>,_false>
             + 8));
  local_190 = local_178.mPattern.mPatterns.
              super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Set>_>_>
              .
              super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_false>
              ._M_head_impl.mUnary;
  IStack_188 = local_178.mPattern.mPatterns.
               super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Set>_>_>
               .
               super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_false>
               ._M_head_impl.mPattern;
  uStack_187 = local_178.mPattern.mPatterns.
               super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Set>_>_>
               .
               super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_false>
               ._M_head_impl._9_7_;
  local_268 = (undefined1  [8])local_1e8._0_8_;
  auStack_260 = (undefined1  [8])local_1e8._8_8_;
  matchit::impl::Id<mathiu::impl::Set>::Id
            ((Id<mathiu::impl::Set> *)&_Stack_258,(Id<mathiu::impl::Set> *)&local_1d8);
  local_210.mUnary = local_190;
  local_210.mPattern = IStack_188;
  local_210._9_7_ = uStack_187;
  _Stack_340._M_parent = (_Base_ptr)0x0;
  local_348 = (_Variadic_union<std::monostate,_const_mathiu::impl::Sum_*,_bool>)0x0;
  _Stack_340._M_color = _S_red;
  _Stack_340._4_4_ = 0;
  local_320 = 0;
  local_2f8 = 0;
  local_308 = 0;
  uStack_300 = 0;
  local_318 = (_Variadic_union<std::monostate,_const_mathiu::impl::Set_*,_bool>)0x0;
  p_Stack_310 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_2b0._0_8_ = (_Variadic_union<matchit::impl::IdBlock<mathiu::impl::Sum>_*>)0x0;
  if (*(__index_type *)((long)_Var1 + 0x38) == '\r') {
    local_2b0._0_8_ = _Var1._M_first._M_storage;
  }
  _Stack_340._M_left = &_Stack_340;
  _Stack_340._M_right = &_Stack_340;
  local_200 = &local_78;
  std::variant<std::monostate,mathiu::impl::Set_const*,bool>::operator=
            ((variant<std::monostate,mathiu::impl::Set_const*,bool> *)&local_318,(Set **)local_2b0);
  lVar3 = local_2f8 * 2;
  local_2f8 = local_2f8 + 1;
  value = std::get<1ul,std::monostate,mathiu::impl::Set_const*,bool>
                    ((variant<std::monostate,_const_mathiu::impl::Set_*,_bool> *)
                     (&local_318 + lVar3));
  bVar4 = matchit::impl::
          PatternTraits<matchit::impl::App<matchit::impl::cast<bool>::{lambda(auto:1&&)#1}const&,bool>>
          ::
          matchPatternImpl<mathiu::impl::Set_const*&,matchit::impl::Context<mathiu::impl::Set_const*,bool>>
                    (value,&local_210,2,(Context<const_mathiu::impl::Set_*,_bool> *)&local_318);
  if (bVar4) {
    bVar4 = matchit::impl::Id<mathiu::impl::Set>::matchValue<mathiu::impl::Set_const&>
                      ((Id<mathiu::impl::Set> *)&_Stack_258,*value);
    IVar16 = (IdProcess)bVar4;
    matchit::impl::PatternTraits<matchit::impl::Id<mathiu::impl::Set>_>::processIdImpl
              ((Id<mathiu::impl::Set> *)&_Stack_258,3,IVar16);
    matchit::impl::PatternTraits<matchit::impl::Id<mathiu::impl::Set>_>::processIdImpl
              ((Id<mathiu::impl::Set> *)&_Stack_258,2,(uint)bVar4);
  }
  else {
    IVar16 = kCANCEL;
  }
  matchit::impl::PatternTraits<matchit::impl::Id<mathiu::impl::Set>_>::processIdImpl
            ((Id<mathiu::impl::Set> *)&_Stack_258,1,IVar16);
  matchit::impl::PatternTraits<matchit::impl::Id<mathiu::impl::Set>_>::processIdImpl
            ((Id<mathiu::impl::Set> *)&_Stack_258,0,IVar16);
  if (IVar16 == kCANCEL) {
    local_318 = (_Variadic_union<std::monostate,_const_mathiu::impl::Set_*,_bool>)
                (varSet->super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>).
                _M_ptr;
    p_Stack_310 = (varSet->super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>)
                  ._M_refcount._M_pi;
    if (p_Stack_310 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Stack_310->_M_use_count = p_Stack_310->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Stack_310->_M_use_count = p_Stack_310->_M_use_count + 1;
      }
    }
    __l._M_len = 1;
    __l._M_array = (iterator)&local_318;
    std::
    set<std::shared_ptr<const_mathiu::impl::Expr>,_mathiu::impl::ExprPtrLess,_std::allocator<std::shared_ptr<const_mathiu::impl::Expr>_>_>
    ::set((set<std::shared_ptr<const_mathiu::impl::Expr>,_mathiu::impl::ExprPtrLess,_std::allocator<std::shared_ptr<const_mathiu::impl::Expr>_>_>
           *)local_2b0,__l,&local_349,&local_34a);
    if (p_Stack_310 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_310);
    }
  }
  else {
    pIVar8 = std::
             visit<matchit::impl::Overload<matchit::impl::Id<mathiu::impl::Set>::block()const::_lambda(matchit::impl::IdBlock<mathiu::impl::Set>&)_1_,matchit::impl::Id<mathiu::impl::Set>::block()const::_lambda(matchit::impl::IdBlock<mathiu::impl::Set>*)_1_>,std::variant<matchit::impl::IdBlock<mathiu::impl::Set>,matchit::impl::IdBlock<mathiu::impl::Set>*>&>
                       ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1321:44)>
                         *)local_2b0,
                        (variant<matchit::impl::IdBlock<mathiu::impl::Set>,_matchit::impl::IdBlock<mathiu::impl::Set>_*>
                         *)&local_200->_M_first);
    p_Var9 = (_Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>,_std::_Identity<std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::shared_ptr<const_mathiu::impl::Expr>_>_>
              *)std::
                visit<matchit::impl::Overload<matchit::impl::IdBlock<mathiu::impl::Set>::get()const::_lambda(mathiu::impl::Set_const&)_1_,matchit::impl::IdBlock<mathiu::impl::Set>::get()const::_lambda(mathiu::impl::Set_const*)_1_,matchit::impl::IdBlock<mathiu::impl::Set>::get()const::_lambda(mathiu::impl::Set*)_1_,matchit::impl::IdBlock<mathiu::impl::Set>::get()const::_lambda(std::monostate_const&)_1_>,std::variant<std::monostate,mathiu::impl::Set,mathiu::impl::Set*,mathiu::impl::Set_const*>const&>
                          ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1186:30),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1187:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1188:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1189:33)>
                            *)local_2b0,&(pIVar8->super_IdBlockBase<mathiu::impl::Set>).mVariant);
    std::
    _Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>,_std::_Identity<std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::shared_ptr<const_mathiu::impl::Expr>_>_>
    ::_Rb_tree((_Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>,_std::_Identity<std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::shared_ptr<const_mathiu::impl::Expr>_>_>
                *)local_2b0,p_Var9);
  }
  std::
  _Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>,_std::_Identity<std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::shared_ptr<const_mathiu::impl::Expr>_>_>
  ::clear((_Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>,_std::_Identity<std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::shared_ptr<const_mathiu::impl::Expr>_>_>
           *)&local_348);
  if ((_Base_ptr)local_2b0._16_8_ != (_Base_ptr)0x0) {
    _Stack_340._M_color = local_2b0._8_4_;
    _Stack_340._M_parent = (_Base_ptr)local_2b0._16_8_;
    _Stack_340._M_left = (_Base_ptr)local_2b0._24_8_;
    _Stack_340._M_right = (_Base_ptr)local_2b0._32_8_;
    *(_Rb_tree_node_base **)(local_2b0._16_8_ + 8) = &_Stack_340;
    local_320 = local_2b0._40_8_;
    local_2b0._16_8_ = (_Base_ptr)0x0;
    local_2b0._40_8_ = 0;
    local_2b0._24_8_ = (_Rb_tree_node_base *)(local_2b0 + 8);
    local_2b0._32_8_ = (_Rb_tree_node_base *)(local_2b0 + 8);
  }
  std::
  _Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>,_std::_Identity<std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::shared_ptr<const_mathiu::impl::Expr>_>_>
  ::~_Rb_tree((_Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>,_std::_Identity<std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::shared_ptr<const_mathiu::impl::Expr>_>_>
               *)local_2b0);
  local_2e0._M_impl.super__Rb_tree_header._M_header._M_parent = _Stack_340._M_parent;
  local_2e0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_2e0._M_impl.super__Rb_tree_header._M_header;
  if (_Stack_340._M_parent == (_Base_ptr)0x0) {
    _Var14 = _S_red;
    psVar15 = &local_2e0._M_impl.super__Rb_tree_header._M_node_count;
    local_2e0._M_impl.super__Rb_tree_header._M_header._M_right =
         local_2e0._M_impl.super__Rb_tree_header._M_header._M_left;
  }
  else {
    psVar15 = &local_320;
    (_Stack_340._M_parent)->_M_parent = local_2e0._M_impl.super__Rb_tree_header._M_header._M_left;
    local_2e0._M_impl.super__Rb_tree_header._M_node_count = local_320;
    _Stack_340._M_parent = (_Base_ptr)0x0;
    local_2e0._M_impl.super__Rb_tree_header._M_header._M_left = _Stack_340._M_left;
    local_2e0._M_impl.super__Rb_tree_header._M_header._M_right = _Stack_340._M_right;
    _Var14 = _Stack_340._M_color;
    _Stack_340._M_left = &_Stack_340;
    _Stack_340._M_right = &_Stack_340;
  }
  *psVar15 = 0;
  local_2e0._M_impl.super__Rb_tree_header._M_header._M_color = _Var14;
  std::
  _Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>,_std::_Identity<std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::shared_ptr<const_mathiu::impl::Expr>_>_>
  ::~_Rb_tree((_Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>,_std::_Identity<std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::shared_ptr<const_mathiu::impl::Expr>_>_>
               *)&local_348);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Set>,_matchit::impl::IdBlock<mathiu::impl::Set>_*>
  ::~_Variant_storage(&_Stack_258);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Set>,_matchit::impl::IdBlock<mathiu::impl::Set>_*>
  ::~_Variant_storage(&local_1d8);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Set>,_matchit::impl::IdBlock<mathiu::impl::Set>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Set>,_matchit::impl::IdBlock<mathiu::impl::Set>_*>
                       *)((long)&local_178.mPattern.mPatterns.
                                 super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Set>_>_>
                                 .
                                 super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Set>_>_>
                                 .
                                 super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Set>_>,_false>
                         + 8));
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Set>,_matchit::impl::IdBlock<mathiu::impl::Set>_*>
  ::~_Variant_storage(&local_c0);
  local_268 = (undefined1  [8])((ulong)local_268 & 0xffffffff00000000);
  auStack_260 = (undefined1  [8])0x0;
  _Stack_258._M_u._M_rest = (_Variadic_union<matchit::impl::IdBlock<mathiu::impl::Set>_*>)0x0;
  _Stack_258._M_u._8_8_ = 0;
  _Stack_258._M_u._16_8_ = 0;
  _Stack_258._M_u._24_8_ = 0;
  _Stack_258._M_u._32_8_ = 0;
  _Stack_258._M_u._40_8_ = 0;
  local_2b0._0_8_ = local_2b0._0_8_ & 0xffffffff00000000;
  local_2b0[0x38] = '\0';
  local_270 = '\0';
  std::__detail::__variant::
  _Variant_storage<false,_std::monostate,_mathiu::impl::Sum,_mathiu::impl::Sum_*,_const_mathiu::impl::Sum_*>
  ::~_Variant_storage((_Variant_storage<false,_std::monostate,_mathiu::impl::Sum,_mathiu::impl::Sum_*,_const_mathiu::impl::Sum_*>
                       *)auStack_260);
  _Var2 = *local_2e8;
  matchit::impl::Id<mathiu::impl::Sum>::Id
            ((Id<mathiu::impl::Sum> *)&local_108,(Id<mathiu::impl::Sum> *)local_2b0);
  matchit::impl::as<mathiu::impl::Sum>::{lambda(auto:1)#1}::operator()
            ((App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>
              *)&local_178,(_lambda_auto_1__1_ *)&matchit::impl::as<mathiu::impl::Sum>,
             (Id<mathiu::impl::Sum> *)&local_108);
  local_1e8._0_8_ = local_178.mUnary;
  local_1e8._8_8_ =
       local_178.mPattern.mPatterns.
       super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Set>_>_>
       .
       super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Set>_>_>
       .
       super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Set>_>,_false>
       ._M_head_impl.mUnary;
  matchit::impl::Id<mathiu::impl::Sum>::Id
            ((Id<mathiu::impl::Sum> *)&local_1d8,
             (Id<mathiu::impl::Sum> *)
             ((long)&local_178.mPattern.mPatterns.
                     super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Set>_>_>
                     .
                     super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Set>_>_>
                     .
                     super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Set>_>,_false>
             + 8));
  local_190 = local_178.mPattern.mPatterns.
              super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Set>_>_>
              .
              super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_false>
              ._M_head_impl.mUnary;
  IStack_188 = local_178.mPattern.mPatterns.
               super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Set>_>_>
               .
               super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_false>
               ._M_head_impl.mPattern;
  uStack_187 = local_178.mPattern.mPatterns.
               super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Set>_>_>
               .
               super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_false>
               ._M_head_impl._9_7_;
  local_268 = (undefined1  [8])local_1e8._0_8_;
  auStack_260 = (undefined1  [8])local_1e8._8_8_;
  matchit::impl::Id<mathiu::impl::Sum>::Id
            ((Id<mathiu::impl::Sum> *)&_Stack_258,(Id<mathiu::impl::Sum> *)&local_1d8);
  local_210.mUnary = local_190;
  local_210.mPattern = IStack_188;
  local_210._9_7_ = uStack_187;
  local_1f8 = &local_2e0;
  _Stack_340._M_right = (_Base_ptr)0x0;
  _Stack_340._M_parent = (_Base_ptr)0x0;
  _Stack_340._M_left = (_Base_ptr)0x0;
  local_348 = (_Variadic_union<std::monostate,_const_mathiu::impl::Sum_*,_bool>)0x0;
  _Stack_340._M_color = _S_red;
  _Stack_340._4_4_ = 0;
  local_318 = (_Variadic_union<std::monostate,_const_mathiu::impl::Set_*,_bool>)0x0;
  if (*(char *)((long)_Var2 + 0x38) == '\a') {
    local_318 = _Var2;
  }
  local_200 = (_Variadic_union<matchit::impl::IdBlock<mathiu::impl::Set>,_matchit::impl::IdBlock<mathiu::impl::Set>_*>
               *)local_2b0;
  std::variant<std::monostate,mathiu::impl::Sum_const*,bool>::operator=
            ((variant<std::monostate,mathiu::impl::Sum_const*,bool> *)&local_348,(Sum **)&local_318)
  ;
  lVar3 = (long)_Stack_340._M_right * 2;
  _Stack_340._M_right = (_Base_ptr)((long)&(_Stack_340._M_right)->_M_color + 1);
  value_00 = std::get<1ul,std::monostate,mathiu::impl::Sum_const*,bool>
                       ((variant<std::monostate,_const_mathiu::impl::Sum_*,_bool> *)
                        (&local_348 + lVar3));
  bVar4 = matchit::impl::
          PatternTraits<matchit::impl::App<matchit::impl::cast<bool>::{lambda(auto:1&&)#1}const&,bool>>
          ::
          matchPatternImpl<mathiu::impl::Sum_const*&,matchit::impl::Context<mathiu::impl::Sum_const*,bool>>
                    (value_00,&local_210,2,(Context<const_mathiu::impl::Sum_*,_bool> *)&local_348);
  if (bVar4) {
    bVar4 = matchit::impl::Id<mathiu::impl::Sum>::matchValue<mathiu::impl::Sum_const&>
                      ((Id<mathiu::impl::Sum> *)&_Stack_258,*value_00);
    IVar16 = (IdProcess)bVar4;
    matchit::impl::PatternTraits<matchit::impl::Id<mathiu::impl::Sum>_>::processIdImpl
              ((Id<mathiu::impl::Sum> *)&_Stack_258,3,IVar16);
    matchit::impl::PatternTraits<matchit::impl::Id<mathiu::impl::Sum>_>::processIdImpl
              ((Id<mathiu::impl::Sum> *)&_Stack_258,2,(uint)bVar4);
    matchit::impl::PatternTraits<matchit::impl::Id<mathiu::impl::Sum>_>::processIdImpl
              ((Id<mathiu::impl::Sum> *)&_Stack_258,1,IVar16);
    matchit::impl::PatternTraits<matchit::impl::Id<mathiu::impl::Sum>_>::processIdImpl
              ((Id<mathiu::impl::Sum> *)&_Stack_258,0,IVar16);
    if (bVar4) {
      pIVar10 = std::
                visit<matchit::impl::Overload<matchit::impl::Id<mathiu::impl::Sum>::block()const::_lambda(matchit::impl::IdBlock<mathiu::impl::Sum>&)_1_,matchit::impl::Id<mathiu::impl::Sum>::block()const::_lambda(matchit::impl::IdBlock<mathiu::impl::Sum>*)_1_>,std::variant<matchit::impl::IdBlock<mathiu::impl::Sum>,matchit::impl::IdBlock<mathiu::impl::Sum>*>&>
                          ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1321:44)>
                            *)&local_318,
                           (variant<matchit::impl::IdBlock<mathiu::impl::Sum>,_matchit::impl::IdBlock<mathiu::impl::Sum>_*>
                            *)local_200);
      pSVar11 = std::
                visit<matchit::impl::Overload<matchit::impl::IdBlock<mathiu::impl::Sum>::get()const::_lambda(mathiu::impl::Sum_const&)_1_,matchit::impl::IdBlock<mathiu::impl::Sum>::get()const::_lambda(mathiu::impl::Sum_const*)_1_,matchit::impl::IdBlock<mathiu::impl::Sum>::get()const::_lambda(mathiu::impl::Sum*)_1_,matchit::impl::IdBlock<mathiu::impl::Sum>::get()const::_lambda(std::monostate_const&)_1_>,std::variant<std::monostate,mathiu::impl::Sum,mathiu::impl::Sum*,mathiu::impl::Sum_const*>const&>
                          ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1186:30),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1187:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1188:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1189:33)>
                            *)&local_318,&(pIVar10->super_IdBlockBase<mathiu::impl::Sum>).mVariant);
      p_Var12 = (pSVar11->super_ExprPtrMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      pIVar10 = std::
                visit<matchit::impl::Overload<matchit::impl::Id<mathiu::impl::Sum>::block()const::_lambda(matchit::impl::IdBlock<mathiu::impl::Sum>&)_1_,matchit::impl::Id<mathiu::impl::Sum>::block()const::_lambda(matchit::impl::IdBlock<mathiu::impl::Sum>*)_1_>,std::variant<matchit::impl::IdBlock<mathiu::impl::Sum>,matchit::impl::IdBlock<mathiu::impl::Sum>*>&>
                          ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1321:44)>
                            *)&local_318,
                           (variant<matchit::impl::IdBlock<mathiu::impl::Sum>,_matchit::impl::IdBlock<mathiu::impl::Sum>_*>
                            *)local_200);
      pSVar11 = std::
                visit<matchit::impl::Overload<matchit::impl::IdBlock<mathiu::impl::Sum>::get()const::_lambda(mathiu::impl::Sum_const&)_1_,matchit::impl::IdBlock<mathiu::impl::Sum>::get()const::_lambda(mathiu::impl::Sum_const*)_1_,matchit::impl::IdBlock<mathiu::impl::Sum>::get()const::_lambda(mathiu::impl::Sum*)_1_,matchit::impl::IdBlock<mathiu::impl::Sum>::get()const::_lambda(std::monostate_const&)_1_>,std::variant<std::monostate,mathiu::impl::Sum,mathiu::impl::Sum*,mathiu::impl::Sum_const*>const&>
                          ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1186:30),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1187:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1188:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1189:33)>
                            *)&local_318,&(pIVar10->super_IdBlockBase<mathiu::impl::Sum>).mVariant);
      p_Var9 = local_1f8;
      p_Var17 = &(pSVar11->super_ExprPtrMap)._M_t._M_impl.super__Rb_tree_header;
      if ((_Rb_tree_header *)p_Var12 == p_Var17) {
        iVar6 = 0;
      }
      else {
        iVar6 = 0;
        do {
          IVar5 = degreeMonomial((ExprPtr *)&p_Var12[1]._M_left,(Set *)p_Var9);
          if (iVar6 < IVar5) {
            iVar6 = IVar5;
          }
          p_Var12 = (_Base_ptr)std::_Rb_tree_increment(p_Var12);
        } while ((_Rb_tree_header *)p_Var12 != p_Var17);
      }
      goto LAB_001d585f;
    }
  }
  else {
    pIVar13 = &std::
               visit<matchit::impl::Overload<matchit::impl::Id<mathiu::impl::Sum>::block()const::_lambda(matchit::impl::IdBlock<mathiu::impl::Sum>&)_1_,matchit::impl::Id<mathiu::impl::Sum>::block()const::_lambda(matchit::impl::IdBlock<mathiu::impl::Sum>*)_1_>,std::variant<matchit::impl::IdBlock<mathiu::impl::Sum>,matchit::impl::IdBlock<mathiu::impl::Sum>*>&>
                         ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1321:44)>
                           *)&local_318,
                          (variant<matchit::impl::IdBlock<mathiu::impl::Sum>,_matchit::impl::IdBlock<mathiu::impl::Sum>_*>
                           *)&_Stack_258)->super_IdBlockBase<mathiu::impl::Sum>;
    matchit::impl::IdBlockBase<mathiu::impl::Sum>::reset(pIVar13,1);
    pIVar13 = &std::
               visit<matchit::impl::Overload<matchit::impl::Id<mathiu::impl::Sum>::block()const::_lambda(matchit::impl::IdBlock<mathiu::impl::Sum>&)_1_,matchit::impl::Id<mathiu::impl::Sum>::block()const::_lambda(matchit::impl::IdBlock<mathiu::impl::Sum>*)_1_>,std::variant<matchit::impl::IdBlock<mathiu::impl::Sum>,matchit::impl::IdBlock<mathiu::impl::Sum>*>&>
                         ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1321:44)>
                           *)&local_318,
                          (variant<matchit::impl::IdBlock<mathiu::impl::Sum>,_matchit::impl::IdBlock<mathiu::impl::Sum>_*>
                           *)&_Stack_258)->super_IdBlockBase<mathiu::impl::Sum>;
    matchit::impl::IdBlockBase<mathiu::impl::Sum>::reset(pIVar13,0);
  }
  iVar6 = degreeMonomial((ExprPtr *)local_2e8,(Set *)&local_2e0);
LAB_001d585f:
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Sum>,_matchit::impl::IdBlock<mathiu::impl::Sum>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Sum>,_matchit::impl::IdBlock<mathiu::impl::Sum>_*>
                       *)&_Stack_258);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Sum>,_matchit::impl::IdBlock<mathiu::impl::Sum>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Sum>,_matchit::impl::IdBlock<mathiu::impl::Sum>_*>
                       *)&local_1d8);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Sum>,_matchit::impl::IdBlock<mathiu::impl::Sum>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Sum>,_matchit::impl::IdBlock<mathiu::impl::Sum>_*>
                       *)((long)&local_178.mPattern.mPatterns.
                                 super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Set>_>_>
                                 .
                                 super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Set>_>_>
                                 .
                                 super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Set>_>,_false>
                         + 8));
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Sum>,_matchit::impl::IdBlock<mathiu::impl::Sum>_*>
  ::~_Variant_storage(&local_108);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Sum>,_matchit::impl::IdBlock<mathiu::impl::Sum>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Sum>,_matchit::impl::IdBlock<mathiu::impl::Sum>_*>
                       *)local_2b0);
  std::
  _Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>,_std::_Identity<std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::shared_ptr<const_mathiu::impl::Expr>_>_>
  ::~_Rb_tree(&local_2e0);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Set>,_matchit::impl::IdBlock<mathiu::impl::Set>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Set>,_matchit::impl::IdBlock<mathiu::impl::Set>_*>
                       *)&local_78._M_first);
  return iVar6;
}

Assistant:

Integer degree(ExprPtr const &ex, ExprPtr const &varSet)
    {
#if DEBUG
        std::cout << "degree: " << toString(ex) << ",\t" << toString(varSet) << std::endl;
#endif // DEBUG

        using namespace matchit;
        Id<Set> iSet;
        auto const varSet_ = match(*varSet)(
            pattern | as<Set>(iSet) = [&]
            { return *iSet; },
            pattern | _ = [&]
            { return Set{{{varSet}}}; });

        Id<Sum> iS;
        return match(*ex)(
            pattern | as<Sum>(iS) = [&]
            { return std::accumulate((*iS).begin(), (*iS).end(), 0, [&](Integer sum, auto &&e)
                                     { return std::max(sum, degreeMonomial(e.second, varSet_)); }); },
            pattern | _ = [&]
            { return degreeMonomial(ex, varSet_); });
    }